

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

uchar __thiscall
EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
          EnvNAVXYTHETALATCfg.Grid2D[X][Y];
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->numofadditionalzlevs;
  if (this->numofadditionalzlevs < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = this->AddLevelGrid2D[uVar4][X][Y];
    if (this->AddLevelGrid2D[uVar4][X][Y] < bVar2) {
      bVar1 = bVar2;
    }
    bVar2 = bVar1;
  }
  return bVar2;
}

Assistant:

unsigned char EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(int X, int Y)
{
    unsigned char mapcost = EnvNAVXYTHETALATCfg.Grid2D[X][Y];

    for (int levind = 0; levind < numofadditionalzlevs; levind++) {
        mapcost = __max(mapcost, AddLevelGrid2D[levind][X][Y]);
    }

    return mapcost;
}